

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_list.c
# Opt level: O1

tester_t *
tester_list_emplace(tester_list_t *list,pid_t pid,size_t rcd,size_t acc,int word_bal,_Bool completed
                   ,_Bool completed_sent,_Bool *err)

{
  tester_list *ptVar1;
  tester_list *ptVar2;
  tester_t *ptVar3;
  
  ptVar2 = (tester_list *)malloc(0x10);
  if ((ptVar2 != (tester_list *)0x0) &&
     (ptVar3 = (tester_t *)malloc(0x20), ptVar3 != (tester_t *)0x0)) {
    ptVar3->pid = pid;
    ptVar3->rcd = rcd;
    ptVar3->acc = acc;
    ptVar3->word_bal = word_bal;
    ptVar3->completed = completed;
    ptVar3->completed_sent = completed_sent;
    ptVar1 = list->next;
    ptVar2->this = ptVar3;
    ptVar2->next = ptVar1;
    list->next = ptVar2;
    return ptVar3;
  }
  if (err != (_Bool *)0x0) {
    *err = true;
  }
  log_formatted("Fail in %s, function: %s",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_list.c"
                ,"tester_list_emplace");
  return (tester_t *)0x0;
}

Assistant:

tester_t * tester_list_emplace(tester_list_t *list, pid_t pid, size_t rcd, size_t acc, int word_bal, bool completed,
                               bool completed_sent, bool *err) {
    TESTER_LIST_ASSERT_OK;

    tester_list_t *new_first = TESTER_LIST_ALLOC;
    PTR_FAIL_IF(new_first == NULL);

    tester_t *new_tester = (tester_t*)malloc(sizeof(tester_t));
    PTR_FAIL_IF(new_tester == NULL);
    new_tester->pid = pid;
    new_tester->rcd = rcd;
    new_tester->acc = acc;
    new_tester->word_bal = word_bal;
    new_tester->completed = completed;
    new_tester->completed_sent = completed_sent;

    tester_list_t * old_first = list->next;
    new_first->this = new_tester;
    new_first->next = old_first;
    list->next = new_first;

    return new_first->this;
}